

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::visitSwitch
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSwitch *node)

{
  Builder *this_00;
  TIntermNode *pTVar1;
  int iVar2;
  Id selector;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  TType *type;
  undefined4 extraout_var_01;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  undefined8 *puVar7;
  uint control;
  vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> codeSegments;
  uint local_8c;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> segmentBlocks;
  vector<int,_std::allocator<int>_> caseValues;
  vector<int,_std::allocator<int>_> valueIndexToSegment;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])
                    (node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])(node);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar2));
  type = (TType *)(**(code **)(*plVar3 + 0xf0))(plVar3);
  selector = accessChainLoad(this,type);
  control = 1;
  if (node->flatten == false) {
    control = (node->dontFlatten & 1) * 2;
  }
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))
                    ((long *)CONCAT44(extraout_var_01,iVar2));
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&valueIndexToSegment,*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8) >> 3,
             (allocator_type *)&segmentBlocks);
  puVar7 = *(undefined8 **)(lVar4 + 8);
  if (puVar7 == *(undefined8 **)(lVar4 + 0x10)) {
    iVar2 = -1;
  }
  else {
    uVar6 = 0xffffffff;
    do {
      segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar7;
      lVar5 = (*(code *)(*segmentBlocks.
                          super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->parent)();
      if ((lVar5 == 0) ||
         (lVar5 = (*(code *)(*segmentBlocks.
                              super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->parent)(),
         *(int *)(lVar5 + 0x20) != 0x16e)) {
        lVar5 = (*(code *)(*segmentBlocks.
                            super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                            super__Vector_impl_data._M_start)->parent)();
        if ((lVar5 == 0) ||
           (lVar5 = (*(code *)(*segmentBlocks.
                                super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                                _M_impl.super__Vector_impl_data._M_start)->parent)(),
           *(int *)(lVar5 + 0x20) != 0x16d)) {
          if (codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<TIntermNode*,std::allocator<TIntermNode*>>::
            _M_realloc_insert<TIntermNode*const&>
                      ((vector<TIntermNode*,std::allocator<TIntermNode*>> *)&codeSegments,
                       (iterator)
                       codeSegments.
                       super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(TIntermNode **)&segmentBlocks);
          }
          else {
            *codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (TIntermNode *)
                 segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          *(int *)((long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start +
                  ((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start)) =
               (int)((ulong)((long)codeSegments.
                                   super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)codeSegments.
                                  super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar5 = (*(code *)(*segmentBlocks.
                              super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->parent)();
          lVar5 = (**(code **)(**(long **)(lVar5 + 0x28) + 0x28))();
          local_8c = **(uint **)(*(long *)(lVar5 + 0xc0) + 8);
          if (caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&caseValues,
                       (iterator)
                       caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_8c);
          }
          else {
            *caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_8c;
            caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      else {
        uVar6 = (ulong)((long)codeSegments.
                              super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)codeSegments.
                             super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3;
      }
      iVar2 = (int)uVar6;
      puVar7 = puVar7 + 1;
    } while (puVar7 != *(undefined8 **)(lVar4 + 0x10));
  }
  if ((((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) &&
      (*(int *)((long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start +
               ((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) + -4) ==
       (int)((ulong)((long)codeSegments.
                           super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)codeSegments.
                          super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     (iVar2 == (int)((ulong)((long)codeSegments.
                                   super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)codeSegments.
                                  super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3))) {
    segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<TIntermNode*,std::allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,std::allocator<TIntermNode*>> *)&codeSegments,
               (TIntermNode **)&segmentBlocks);
  }
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->builder;
  spv::Builder::makeSwitch
            (this_00,selector,control,
             (int)((ulong)((long)codeSegments.
                                 super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)codeSegments.
                                super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3),&caseValues,
             &valueIndexToSegment,iVar2,&segmentBlocks);
  local_8c = local_8c & 0xffffff00;
  std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
            (&(this->breakForLoop).c,(bool *)&local_8c);
  if (codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      spv::Builder::nextSwitchSegment(this_00,&segmentBlocks,(int)uVar6);
      pTVar1 = codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      if (pTVar1 == (TIntermNode *)0x0) {
        spv::Builder::addSwitchBreak(this_00,true);
      }
      else {
        (*pTVar1->_vptr_TIntermNode[2])(pTVar1,this);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)((long)codeSegments.
                                   super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)codeSegments.
                                   super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
  spv::Builder::endSwitch(this_00,&segmentBlocks);
  if (segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)segmentBlocks.
                          super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)segmentBlocks.
                          super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)codeSegments.
                          super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)codeSegments.
                          super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSwitch(glslang::TVisit /* visit */, glslang::TIntermSwitch* node)
{
    // emit and get the condition before doing anything with switch
    node->getCondition()->traverse(this);
    spv::Id selector = accessChainLoad(node->getCondition()->getAsTyped()->getType());

    // Selection control:
    const spv::SelectionControlMask control = TranslateSwitchControl(*node);

    // browse the children to sort out code segments
    int defaultSegment = -1;
    std::vector<TIntermNode*> codeSegments;
    glslang::TIntermSequence& sequence = node->getBody()->getSequence();
    std::vector<int> caseValues;
    std::vector<int> valueIndexToSegment(sequence.size());  // note: probably not all are used, it is an overestimate
    for (glslang::TIntermSequence::iterator c = sequence.begin(); c != sequence.end(); ++c) {
        TIntermNode* child = *c;
        if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpDefault)
            defaultSegment = (int)codeSegments.size();
        else if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpCase) {
            valueIndexToSegment[caseValues.size()] = (int)codeSegments.size();
            caseValues.push_back(child->getAsBranchNode()->getExpression()->getAsConstantUnion()
                ->getConstArray()[0].getIConst());
        } else
            codeSegments.push_back(child);
    }

    // handle the case where the last code segment is missing, due to no code
    // statements between the last case and the end of the switch statement
    if ((caseValues.size() && (int)codeSegments.size() == valueIndexToSegment[caseValues.size() - 1]) ||
        (int)codeSegments.size() == defaultSegment)
        codeSegments.push_back(nullptr);

    // make the switch statement
    std::vector<spv::Block*> segmentBlocks; // returned, as the blocks allocated in the call
    builder.makeSwitch(selector, control, (int)codeSegments.size(), caseValues, valueIndexToSegment, defaultSegment,
        segmentBlocks);

    // emit all the code in the segments
    breakForLoop.push(false);
    for (unsigned int s = 0; s < codeSegments.size(); ++s) {
        builder.nextSwitchSegment(segmentBlocks, s);
        if (codeSegments[s])
            codeSegments[s]->traverse(this);
        else
            builder.addSwitchBreak(true);
    }
    breakForLoop.pop();

    builder.endSwitch(segmentBlocks);

    return false;
}